

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::StructUnionTypeSyntax::StructUnionTypeSyntax
          (StructUnionTypeSyntax *this,SyntaxKind kind,Token keyword,Token taggedOrSoft,Token packed
          ,Token signing,Token openBrace,SyntaxList<slang::syntax::StructUnionMemberSyntax> *members
          ,Token closeBrace,SyntaxList<slang::syntax::VariableDimensionSyntax> *dimensions)

{
  bool bVar1;
  reference ppSVar2;
  reference ppVVar3;
  SyntaxNode *in_RCX;
  undefined8 in_RDX;
  SyntaxNode *in_RDI;
  SyntaxNode *in_R8;
  undefined8 in_R9;
  VariableDimensionSyntax *child_1;
  iterator __end2_1;
  iterator __begin2_1;
  SyntaxList<slang::syntax::VariableDimensionSyntax> *__range2_1;
  StructUnionMemberSyntax *child;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::StructUnionMemberSyntax> *__range2;
  SyntaxList<slang::syntax::StructUnionMemberSyntax> *this_00;
  SyntaxList<slang::syntax::StructUnionMemberSyntax> *this_01;
  span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL> *this_02;
  __normal_iterator<slang::syntax::VariableDimensionSyntax_**,_std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>_>
  local_60;
  SyntaxNode **local_58;
  StructUnionMemberSyntax *local_50;
  StructUnionMemberSyntax **local_48;
  __normal_iterator<slang::syntax::StructUnionMemberSyntax_**,_std::span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL>_>
  local_40;
  SyntaxNode **local_38;
  SyntaxNode *local_20;
  undefined8 local_18;
  undefined8 local_10;
  SyntaxNode *local_8;
  
  this_02 = (span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL> *)&child_1;
  this_01 = (SyntaxList<slang::syntax::StructUnionMemberSyntax> *)&stack0x00000018;
  this_00 = (SyntaxList<slang::syntax::StructUnionMemberSyntax> *)&stack0x00000008;
  local_20 = in_R8;
  local_18 = in_R9;
  local_10 = in_RDX;
  local_8 = in_RCX;
  DataTypeSyntax::DataTypeSyntax((DataTypeSyntax *)this_01,(SyntaxKind)((ulong)this_00 >> 0x20));
  *(undefined8 *)(in_RDI + 1) = local_10;
  in_RDI[1].parent = local_8;
  in_RDI[1].previewNode = local_20;
  *(undefined8 *)(in_RDI + 2) = local_18;
  in_RDI[2].parent = (SyntaxNode *)(this_00->super_SyntaxListBase)._vptr_SyntaxListBase;
  in_RDI[2].previewNode = *(SyntaxNode **)&(this_00->super_SyntaxListBase).super_SyntaxNode;
  *(_func_int ***)(in_RDI + 3) = (this_01->super_SyntaxListBase)._vptr_SyntaxListBase;
  in_RDI[3].parent = *(SyntaxNode **)&(this_01->super_SyntaxListBase).super_SyntaxNode;
  in_RDI[3].previewNode = (SyntaxNode *)this_02->_M_ptr;
  *(size_t *)(in_RDI + 4) = (this_02->_M_extent)._M_extent_value;
  SyntaxList<slang::syntax::StructUnionMemberSyntax>::SyntaxList(this_01,this_00);
  in_RDI[6].previewNode = (SyntaxNode *)__range2_1;
  *(StructUnionMemberSyntax **)(in_RDI + 7) = child;
  SyntaxList<slang::syntax::VariableDimensionSyntax>::SyntaxList
            ((SyntaxList<slang::syntax::VariableDimensionSyntax> *)this_01,
             (SyntaxList<slang::syntax::VariableDimensionSyntax> *)this_00);
  *(SyntaxNode **)(in_RDI + 5) = in_RDI;
  local_38 = &in_RDI[4].parent;
  local_40._M_current =
       (StructUnionMemberSyntax **)
       std::span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL>::begin
                 ((span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL> *)this_00)
  ;
  local_48 = (StructUnionMemberSyntax **)
             std::span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL>::end
                       (this_02);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<slang::syntax::StructUnionMemberSyntax_**,_std::span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL>_>
                      ((__normal_iterator<slang::syntax::StructUnionMemberSyntax_**,_std::span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL>_>
                        *)this_01,
                       (__normal_iterator<slang::syntax::StructUnionMemberSyntax_**,_std::span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL>_>
                        *)this_00);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppSVar2 = __gnu_cxx::
              __normal_iterator<slang::syntax::StructUnionMemberSyntax_**,_std::span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL>_>
              ::operator*(&local_40);
    local_50 = *ppSVar2;
    (local_50->super_SyntaxNode).parent = in_RDI;
    __gnu_cxx::
    __normal_iterator<slang::syntax::StructUnionMemberSyntax_**,_std::span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL>_>
    ::operator++(&local_40);
  }
  *(SyntaxNode **)(in_RDI + 8) = in_RDI;
  local_58 = &in_RDI[7].parent;
  local_60._M_current =
       (VariableDimensionSyntax **)
       std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>::begin
                 ((span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL> *)this_00)
  ;
  std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>::end
            ((span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL> *)this_02);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<slang::syntax::VariableDimensionSyntax_**,_std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>_>
                      ((__normal_iterator<slang::syntax::VariableDimensionSyntax_**,_std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>_>
                        *)this_01,
                       (__normal_iterator<slang::syntax::VariableDimensionSyntax_**,_std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>_>
                        *)this_00);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppVVar3 = __gnu_cxx::
              __normal_iterator<slang::syntax::VariableDimensionSyntax_**,_std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>_>
              ::operator*(&local_60);
    ((*ppVVar3)->super_SyntaxNode).parent = in_RDI;
    __gnu_cxx::
    __normal_iterator<slang::syntax::VariableDimensionSyntax_**,_std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>_>
    ::operator++(&local_60);
  }
  return;
}

Assistant:

StructUnionTypeSyntax(SyntaxKind kind, Token keyword, Token taggedOrSoft, Token packed, Token signing, Token openBrace, const SyntaxList<StructUnionMemberSyntax>& members, Token closeBrace, const SyntaxList<VariableDimensionSyntax>& dimensions) :
        DataTypeSyntax(kind), keyword(keyword), taggedOrSoft(taggedOrSoft), packed(packed), signing(signing), openBrace(openBrace), members(members), closeBrace(closeBrace), dimensions(dimensions) {
        this->members.parent = this;
        for (auto child : this->members)
            child->parent = this;
        this->dimensions.parent = this;
        for (auto child : this->dimensions)
            child->parent = this;
    }